

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<wasm::Ok> *
wasm::WATParser::makeStructRMW<wasm::WATParser::NullCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,NullCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,AtomicRMWOp op)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  undefined1 local_130 [8];
  Result<wasm::MemoryOrder> order1;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  string local_e8;
  undefined1 local_c8 [8];
  Result<wasm::MemoryOrder> order2;
  Result<wasm::Ok> _val_3;
  Result<wasm::Ok> field;
  Result<wasm::Ok> type;
  
  memorder<wasm::WATParser::NullCtx>((Result<wasm::MemoryOrder> *)local_130,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)local_c8,
             (_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)local_130);
  if (order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
      super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
      super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
      super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
      super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
      super__Variant_storage_alias<wasm::MemoryOrder,_wasm::Err>._M_u._24_1_ == '\x01') {
    puVar1 = (undefined1 *)
             ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
    field.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>
    .super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _32_8_ = puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
               CONCAT44(local_c8._4_4_,local_c8._0_4_),
               order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
               super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Variant_storage_alias<wasm::MemoryOrder,_wasm::Err>._M_u._0_8_ +
               CONCAT44(local_c8._4_4_,local_c8._0_4_));
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
    if ((undefined1 *)
        field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == puVar1) {
      *puVar2 = CONCAT71(type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                         type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
           field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           CONCAT71(type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                    type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
         type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>
         .super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)local_c8);
    memorder<wasm::WATParser::NullCtx>((Result<wasm::MemoryOrder> *)local_c8,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)
               ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
               (_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)local_c8);
    if (type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      puVar1 = (undefined1 *)
               ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
      _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = puVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                 field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_,
                 type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ +
                 field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
      if ((undefined1 *)
          _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == puVar1) {
        *puVar2 = field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
             field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
             _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
           field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)
                        ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)
                        ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      if (local_130._0_4_ == local_c8._0_4_) {
        typeidx<wasm::WATParser::NullCtx>
                  ((Result<wasm::Ok> *)
                   ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                   (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        if (field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
          puVar1 = (undefined1 *)
                   ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
          order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
          super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
          super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
          super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
          super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
          super__Variant_storage_alias<wasm::MemoryOrder,_wasm::Err>._32_8_ = puVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                             super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                             super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                             super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),
                     _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_,
                     field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ +
                     _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
          puVar2 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
          if ((undefined1 *)
              order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
              super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
              super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
              super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
              super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
              super__Variant_storage_alias<wasm::MemoryOrder,_wasm::Err>._32_8_ == puVar1) {
            *puVar2 = _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
                 _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
                 order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                 super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                 super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                 super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                 super__Variant_storage_alias<wasm::MemoryOrder,_wasm::Err>._32_8_;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
                 _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
               _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                     ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          fieldidx<wasm::WATParser::NullCtx>
                    ((__index_type *)
                     ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                    ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
                     ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                             super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                             super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                             super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),
                     (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
                     ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          if (_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
            order1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
            super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
            super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
            super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
            super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
            super__Variant_storage_alias<wasm::MemoryOrder,_wasm::Err>._32_8_ = &local_f8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       ((long)&order1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                               super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                               super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                               super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),
                       order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Variant_storage_alias<wasm::MemoryOrder,_wasm::Err>._32_8_,
                       _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ +
                       order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Variant_storage_alias<wasm::MemoryOrder,_wasm::Err>._32_8_);
            puVar2 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
            if ((undefined8 *)
                order1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                super__Variant_storage_alias<wasm::MemoryOrder,_wasm::Err>._32_8_ == &local_f8) {
              *puVar2 = local_f8;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_f0;
            }
            else {
              *(undefined8 *)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
                   order1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                   super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                   super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                   super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                   super__Variant_storage_alias<wasm::MemoryOrder,_wasm::Err>._32_8_;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_f8;
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_100;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                              ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                      super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
          }
          else {
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                              ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                      super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
          }
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      }
      else {
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"struct.atomic.rmw memory orders must be identical","");
        Lexer::err((Err *)((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&ctx->in,
                   (ulong)pos,&local_e8);
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
        puVar1 = (undefined1 *)
                 ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
        if ((undefined1 *)
            field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == puVar1) {
          *puVar2 = CONCAT71(type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                             type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
               type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
               field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
          *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
               CONCAT71(type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                        type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
             type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
        type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
        type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)local_c8);
  std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)local_130);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeStructRMW(Ctx& ctx,
                       Index pos,
                       const std::vector<Annotation>& annotations,
                       AtomicRMWOp op) {
  auto order1 = memorder(ctx);
  CHECK_ERR(order1);
  auto order2 = memorder(ctx);
  CHECK_ERR(order2);
  if (*order1 != *order2) {
    return ctx.in.err(pos, "struct.atomic.rmw memory orders must be identical");
  }
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  auto field = fieldidx(ctx, *type);
  CHECK_ERR(field);
  return ctx.makeStructRMW(pos, annotations, op, *type, *field, *order1);
}